

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

void __thiscall Func::NumberInstrs(Func *this)

{
  Instr **ppIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  uint32 number;
  Instr *this_00;
  
  if (this->parentFunc != (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x4b4,"(this->IsTopFunc())","this->IsTopFunc()");
    if (!bVar3) goto LAB_004283c3;
    *puVar4 = 0;
  }
  if (this->hasInstrNumber == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x4b5,"(!this->hasInstrNumber)","!this->hasInstrNumber");
    if (!bVar3) {
LAB_004283c3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this->hasInstrNumber = true;
  this_00 = this->m_headInstr;
  if (this_00 != (Instr *)0x0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pIVar5 = (Instr *)0x0;
    number = 1;
    do {
      if ((pIVar5 != (Instr *)0x0) && (pIVar5->m_next != this_00)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x4ba,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar3) goto LAB_004283c3;
        *puVar4 = 0;
      }
      IR::Instr::SetNumber(this_00,number);
      ppIVar1 = &this_00->m_next;
      pIVar5 = this_00;
      this_00 = *ppIVar1;
      number = number + 1;
    } while (*ppIVar1 != (Instr *)0x0);
  }
  return;
}

Assistant:

void
Func::NumberInstrs()
{
#if DBG_DUMP
    Assert(this->IsTopFunc());
    Assert(!this->hasInstrNumber);
    this->hasInstrNumber = true;
#endif
    uint instrCount = 1;

    FOREACH_INSTR_IN_FUNC(instr, this)
    {
        instr->SetNumber(instrCount++);
    }
    NEXT_INSTR_IN_FUNC;
}